

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

Iterator * __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::insert
          (Iterator *__return_storage_ptr__,KDTree<phosg::Vector2<long>,_long> *this,
          Vector2<long> *pt,long *v)

{
  Node *new_node;
  Node *n;
  long *v_local;
  Vector2<long> *pt_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  new_node = (Node *)operator_new(0x38);
  KDTree<phosg::Vector2<long>,long>::Node::Node<long_const&>((Node *)new_node,pt,v);
  link_node(this,new_node);
  Iterator::Iterator(__return_storage_ptr__,new_node);
  return __return_storage_ptr__;
}

Assistant:

typename KDTree<CoordType, ValueType>::Iterator
KDTree<CoordType, ValueType>::insert(const CoordType& pt, const ValueType& v) {
  Node* n = new Node(pt, v);
  this->link_node(n);
  return Iterator(n);
}